

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rs_projections.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int local_4;
  
  bVar1 = testRSDoubleLinProjection();
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"rsDoubleLinProjection test passed\n");
    bVar1 = testRSSingleLinProjection();
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"rsSingleLinProjection test passed\n");
      local_4 = 0;
    }
    else {
      std::operator<<((ostream *)&std::cerr,"rsSingleLinProjection test did not pass\n");
      local_4 = 1;
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"rsDoubleLinProjection test did not pass\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv){

if(testRSDoubleLinProjection()){
    std::cout << "rsDoubleLinProjection test passed\n";
}else{
    std::cerr << "rsDoubleLinProjection test did not pass\n";
    return 1;
};

if(testRSSingleLinProjection()){
    std::cout << "rsSingleLinProjection test passed\n";
}else{
    std::cerr << "rsSingleLinProjection test did not pass\n";
    return 1;
};

return 0;
}